

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O1

TRef lj_opt_dse_ustore(jit_State *J)

{
  IRType1 *pIVar1;
  ushort uVar2;
  IRRef1 IVar3;
  ushort uVar4;
  IRIns *pIVar5;
  bool bVar6;
  IRRef1 *pIVar7;
  AliasRet AVar8;
  int iVar9;
  uint uVar10;
  TRef TVar11;
  IRIns *pIVar12;
  IRRef1 *pIVar13;
  IRIns *pIVar14;
  uint uVar15;
  IRRef1 *local_40;
  
  uVar2 = (J->fold).ins.field_0.op1;
  IVar3 = (J->fold).ins.field_0.op2;
  pIVar5 = (J->cur).ir;
  local_40 = J->chain + 0x4a;
  uVar15 = (uint)J->chain[0x4a];
  do {
    if (uVar15 <= uVar2) goto LAB_00132f00;
    pIVar12 = (J->cur).ir;
    pIVar14 = pIVar12 + uVar15;
    AVar8 = aa_uref((IRIns *)((ulong)((uint)uVar2 * 8) + (long)pIVar5),
                    pIVar12 + (pIVar14->field_0).op1);
    if (AVar8 == ALIAS_MUST) {
      iVar9 = 1;
      if ((pIVar14->field_0).op2 != IVar3) {
        if (J->chain[0x11] < uVar15) {
          uVar10 = (J->cur).nins - 1;
          bVar6 = uVar15 < uVar10;
          if (uVar15 < uVar10) {
            iVar9 = 5;
            if (-1 < *(char *)((long)pIVar12 + (ulong)uVar10 * 8 + 4)) {
              pIVar12 = pIVar12 + ((ulong)uVar10 - 1);
              do {
                bVar6 = pIVar14 < pIVar12;
                if (pIVar12 <= pIVar14) goto LAB_00132e7e;
                pIVar1 = &(pIVar12->field_1).t;
                pIVar12 = pIVar12 + -1;
              } while (-1 < (char)pIVar1->irt);
            }
          }
          else {
LAB_00132e7e:
            *local_40 = (pIVar14->field_0).prev;
            *pIVar14 = (IRIns)0xc0000000000;
            iVar9 = 0;
            if (((uVar15 + 1 < (J->cur).nins) && (*(char *)((long)pIVar14 + 0xd) == 'W')) &&
               (pIVar14[1].field_0.op1 == uVar2)) {
              pIVar12 = (J->cur).ir;
              pIVar7 = J->chain + 0x57;
              do {
                pIVar13 = pIVar7;
                uVar4 = *pIVar13;
                pIVar7 = &(&pIVar12->field_0)[uVar4].prev;
              } while (uVar15 + 1 < (uint)uVar4);
              pIVar12 = pIVar12 + uVar4;
              *pIVar13 = (pIVar12->field_0).prev;
              *pIVar12 = (IRIns)0xc0000000000;
            }
          }
          if (bVar6) goto LAB_00132ef3;
        }
        iVar9 = 5;
      }
    }
    else if ((AVar8 != ALIAS_MAY) || (iVar9 = 5, (pIVar14->field_0).op2 == IVar3)) {
      uVar15 = (uint)(pIVar14->field_0).prev;
      local_40 = &(pIVar14->field_0).prev;
      iVar9 = 0;
    }
LAB_00132ef3:
  } while (iVar9 == 0);
  if (iVar9 != 5) {
    return 4;
  }
LAB_00132f00:
  TVar11 = lj_ir_emit(J);
  return TVar11;
}

Assistant:

TRef LJ_FASTCALL lj_opt_dse_ustore(jit_State *J)
{
  IRRef xref = fins->op1;  /* xREF reference. */
  IRRef val = fins->op2;  /* Stored value reference. */
  IRIns *xr = IR(xref);
  IRRef1 *refp = &J->chain[IR_USTORE];
  IRRef ref = *refp;
  while (ref > xref) {  /* Search for redundant or conflicting stores. */
    IRIns *store = IR(ref);
    switch (aa_uref(xr, IR(store->op1))) {
    case ALIAS_NO:
      break;  /* Continue searching. */
    case ALIAS_MAY:	/* Store to MAYBE the same location. */
      if (store->op2 != val)  /* Conflict if the value is different. */
	goto doemit;
      break;  /* Otherwise continue searching. */
    case ALIAS_MUST:	/* Store to the same location. */
      if (store->op2 == val)  /* Same value: drop the new store. */
	return DROPFOLD;
      /* Different value: try to eliminate the redundant store. */
      if (ref > J->chain[IR_LOOP]) {  /* Quick check to avoid crossing LOOP. */
	IRIns *ir;
	/* Check for any intervening guards (includes conflicting loads). */
	for (ir = IR(J->cur.nins-1); ir > store; ir--)
	  if (irt_isguard(ir->t))
	    goto doemit;  /* No elimination possible. */
	/* Remove redundant store from chain and replace with NOP. */
	*refp = store->prev;
	lj_ir_nop(store);
	if (ref+1 < J->cur.nins &&
	    store[1].o == IR_OBAR && store[1].op1 == xref) {
	  IRRef1 *bp = &J->chain[IR_OBAR];
	  IRIns *obar;
	  for (obar = IR(*bp); *bp > ref+1; obar = IR(*bp))
	    bp = &obar->prev;
	  /* Remove OBAR, too. */
	  *bp = obar->prev;
	  lj_ir_nop(obar);
	}
	/* Now emit the new store instead. */
      }
      goto doemit;
    }
    ref = *(refp = &store->prev);
  }
doemit:
  return EMITFOLD;  /* Otherwise we have a conflict or simply no match. */
}